

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDScanner.cpp
# Opt level: O3

void __thiscall xercesc_4_0::DTDScanner::scanEntityDecl(DTDScanner *this)

{
  ReaderMgr *pRVar1;
  XMLReader *pXVar2;
  XMLBufferMgr *this_00;
  XMLCh *pXVar3;
  NameIdPool<xercesc_4_0::DTDEntityDecl> *pNVar4;
  DTDGrammar *this_01;
  DTDEntityDecl *pDVar5;
  DocTypeHandler *pDVar6;
  XMLScanner *this_02;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  XMLCh XVar10;
  int iVar11;
  XMLBuffer *toFill;
  ulong uVar12;
  DTDEntityDecl *pDVar13;
  NameIdPool<xercesc_4_0::DTDEntityDecl> **ppNVar14;
  XMLCh *pXVar15;
  RefHashTableBucketElem<xercesc_4_0::DTDEntityDecl> *pRVar16;
  XMLBufBid bbName;
  
  pRVar1 = this->fReaderMgr;
  XVar10 = ReaderMgr::peekNextChar(pRVar1);
  if ((char)pRVar1->fCurReader->fgCharCharsTable[(ushort)XVar10] < '\0') {
    ReaderMgr::skipPastSpaces(this->fReaderMgr);
  }
  else {
    XMLScanner::emitError(this->fScanner,ExpectedWhitespace);
  }
  bVar7 = ReaderMgr::skippedChar(this->fReaderMgr,L'%');
  if (bVar7) {
    pXVar2 = this->fReaderMgr->fCurReader;
    XVar10 = ReaderMgr::peekNextChar(this->fReaderMgr);
    if (-1 < (char)pXVar2->fgCharCharsTable[(ushort)XVar10]) {
      do {
        bVar7 = expandPERef(this,false,false,true,false);
        if (!bVar7) {
          XMLScanner::emitError(this->fScanner,ExpectedEntityRefName);
        }
        bVar7 = ReaderMgr::skippedSpace(this->fReaderMgr);
        if (bVar7) {
          ReaderMgr::skipPastSpaces(this->fReaderMgr);
        }
        bVar7 = ReaderMgr::skippedChar(this->fReaderMgr,L'%');
      } while (bVar7);
      goto LAB_0030373b;
    }
    bVar8 = checkForPERef(this,false,true);
    bVar7 = true;
    if (!bVar8) {
      XMLScanner::emitError(this->fScanner,ExpectedWhitespace);
    }
  }
  else {
LAB_0030373b:
    bVar7 = false;
  }
  this_00 = this->fBufMgr;
  toFill = XMLBufferMgr::bidOnBuffer(this_00);
  pRVar1 = this->fReaderMgr;
  toFill->fIndex = 0;
  bVar8 = XMLReader::getName(pRVar1->fCurReader,toFill,false);
  if (!bVar8) {
    XMLScanner::emitError(this->fScanner,ExpectedPEName);
    pRVar1 = this->fReaderMgr;
    do {
      XVar10 = ReaderMgr::getNextChar(pRVar1);
      if (XVar10 == L'\0') break;
    } while (XVar10 != L'>');
    goto LAB_00303aba;
  }
  if (this->fScanner->fDoNamespaces == true) {
    pXVar3 = toFill->fBuffer;
    pXVar3[toFill->fIndex] = L'\0';
    iVar11 = XMLString::indexOf(pXVar3,L':');
    if (iVar11 != -1) {
      XMLScanner::emitError(this->fScanner,ColonNotLegalWithNS);
    }
  }
  pXVar3 = toFill->fBuffer;
  if (bVar7 == false) {
    this_01 = this->fDTDGrammar;
    pXVar3[toFill->fIndex] = L'\0';
    pDVar13 = DTDGrammar::getEntityDecl(this_01,pXVar3);
LAB_00303860:
    if (pDVar13 == (DTDEntityDecl *)0x0) goto LAB_0030393b;
    pDVar13 = this->fDumEntityDecl;
    if (pDVar13 == (DTDEntityDecl *)0x0) {
      pDVar13 = (DTDEntityDecl *)XMemory::operator_new(0x60,this->fMemoryManager);
      XMLEntityDecl::XMLEntityDecl((XMLEntityDecl *)pDVar13,this->fMemoryManager);
      (pDVar13->super_XMLEntityDecl).super_XSerializable._vptr_XSerializable =
           (_func_int **)&PTR__XMLEntityDecl_00408758;
      pDVar13->fDeclaredInIntSubset = false;
      pDVar13->fIsParameter = false;
      pDVar13->fIsSpecialChar = false;
      this->fDumEntityDecl = pDVar13;
    }
    pXVar3 = toFill->fBuffer;
    pXVar3[toFill->fIndex] = L'\0';
    XMLEntityDecl::setName(&pDVar13->super_XMLEntityDecl,pXVar3);
    pDVar13 = this->fDumEntityDecl;
  }
  else {
    pNVar4 = this->fPEntityDeclPool;
    pXVar3[toFill->fIndex] = L'\0';
    if (pNVar4->fIdCounter != 0) {
      uVar12 = (ulong)(ushort)*pXVar3;
      if (uVar12 == 0) {
        uVar12 = 0;
      }
      else {
        XVar10 = pXVar3[1];
        if (XVar10 != L'\0') {
          pXVar15 = pXVar3 + 2;
          do {
            uVar12 = (ulong)(ushort)XVar10 + (uVar12 >> 0x18) + uVar12 * 0x26;
            XVar10 = *pXVar15;
            pXVar15 = pXVar15 + 1;
          } while (XVar10 != L'\0');
        }
        uVar12 = uVar12 % (pNVar4->fBucketList).fHashModulus;
      }
      pRVar16 = (pNVar4->fBucketList).fBucketList[uVar12];
      if (pRVar16 != (RefHashTableBucketElem<xercesc_4_0::DTDEntityDecl> *)0x0) {
        do {
          bVar8 = StringHasher::equals
                            ((StringHasher *)&(pNVar4->fBucketList).field_0x30,pXVar3,pRVar16->fKey)
          ;
          if (bVar8) {
            pDVar13 = pRVar16->fData;
            goto LAB_00303860;
          }
          pRVar16 = pRVar16->fNext;
        } while (pRVar16 != (RefHashTableBucketElem<xercesc_4_0::DTDEntityDecl> *)0x0);
      }
    }
LAB_0030393b:
    pDVar13 = (DTDEntityDecl *)XMemory::operator_new(0x60,this->fGrammarPoolMemoryManager);
    pXVar3 = toFill->fBuffer;
    pXVar3[toFill->fIndex] = L'\0';
    XMLEntityDecl::XMLEntityDecl((XMLEntityDecl *)pDVar13,pXVar3,this->fGrammarPoolMemoryManager);
    (pDVar13->super_XMLEntityDecl).super_XSerializable._vptr_XSerializable =
         (_func_int **)&PTR__XMLEntityDecl_00408758;
    pDVar13->fIsParameter = false;
    pDVar13->fIsSpecialChar = false;
    pDVar13->fDeclaredInIntSubset = this->fInternalSubset;
    ppNVar14 = &this->fDTDGrammar->fEntityDeclPool;
    if (bVar7 != false) {
      ppNVar14 = &this->fPEntityDeclPool;
    }
    NameIdPool<xercesc_4_0::DTDEntityDecl>::put(*ppNVar14,pDVar13);
  }
  pDVar5 = this->fDumEntityDecl;
  pDVar13->fIsParameter = bVar7;
  bVar8 = checkForPERef(this,false,true);
  if (!bVar8) {
    XMLScanner::emitError(this->fScanner,ExpectedWhitespace);
  }
  bVar8 = this->fScanner->fHasNoDTD;
  if ((bVar7 & bVar8) == 1) {
    this->fScanner->fHasNoDTD = false;
  }
  bVar9 = scanEntityDef(this,pDVar13,bVar7);
  if (bVar9) {
    if (bVar8 != false) {
      this->fScanner->fHasNoDTD = true;
    }
    checkForPERef(this,false,true);
    bVar8 = ReaderMgr::skippedChar(this->fReaderMgr,L'>');
    if (!bVar8) {
      XMLScanner::emitError
                (this->fScanner,UnterminatedEntityDecl,(pDVar13->super_XMLEntityDecl).fName,
                 (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
      pRVar1 = this->fReaderMgr;
      do {
        XVar10 = ReaderMgr::getNextChar(pRVar1);
        if (XVar10 == L'>') break;
      } while (XVar10 != L'\0');
    }
    pDVar6 = this->fDocTypeHandler;
    if (pDVar6 != (DocTypeHandler *)0x0) {
      (*pDVar6->_vptr_DocTypeHandler[0xb])(pDVar6,pDVar13,(ulong)bVar7,(ulong)(pDVar13 == pDVar5));
    }
  }
  else {
    pRVar1 = this->fReaderMgr;
    do {
      XVar10 = ReaderMgr::getNextChar(pRVar1);
      if (XVar10 == L'>') break;
    } while (XVar10 != L'\0');
    this_02 = this->fScanner;
    this_02->fHasNoDTD = true;
    XMLScanner::emitError(this_02,ExpectedEntityValue);
  }
LAB_00303aba:
  XMLBufferMgr::releaseBuffer(this_00,toFill);
  return;
}

Assistant:

void DTDScanner::scanEntityDecl()
{
    //
    //  Space is required here, but we cannot check for a PE Ref since
    //  there could be a legal (no-ref) percent sign here. Since any
    //  entity that ended here would be illegal, we just skip spaces
    //  and then check for a percent.
    //
    if (!fReaderMgr->lookingAtSpace())
        fScanner->emitError(XMLErrs::ExpectedWhitespace);
    else
        fReaderMgr->skipPastSpaces();
    bool isPEDecl = fReaderMgr->skippedChar(chPercent);

    //
    //  If a PE decl, then check if it is followed by a space; if it is so, 
    //  eat the percent and check for spaces or a PE ref on the other side of it. 
    //  Otherwise, it has to be an entity reference for a general entity.
    //
    if (isPEDecl)
    {
        if(!fReaderMgr->getCurrentReader()->isWhitespace(fReaderMgr->peekNextChar()))
        {
            isPEDecl=false;
            while (true)
            {
               if (!expandPERef(false, false, true, false))
                  fScanner->emitError(XMLErrs::ExpectedEntityRefName);
               // And skip any more spaces in the expanded value
               if (fReaderMgr->skippedSpace())
                  fReaderMgr->skipPastSpaces();
               if (!fReaderMgr->skippedChar(chPercent))
                  break;
            }
        }
        else if (!checkForPERef(false, true))
            fScanner->emitError(XMLErrs::ExpectedWhitespace);
    }

    //
    //  Now lets get a name, which should be the name of the entity. We
    //  have to get a buffer for this.
    //
    XMLBufBid bbName(fBufMgr);
    if (!fReaderMgr->getName(bbName.getBuffer()))
    {
        fScanner->emitError(XMLErrs::ExpectedPEName);
        fReaderMgr->skipPastChar(chCloseAngle);
        return;
    }

    // If namespaces are enabled, then no colons allowed
    if (fScanner->getDoNamespaces())
    {
        if (XMLString::indexOf(bbName.getRawBuffer(), chColon) != -1)
            fScanner->emitError(XMLErrs::ColonNotLegalWithNS);
    }

    //
    //  See if this entity already exists. If so, then the existing one
    //  takes precendence. So we use the local dummy decl to parse into
    //  and just ignore the results.
    //
    DTDEntityDecl* entityDecl;
    if (isPEDecl)
        entityDecl = fPEntityDeclPool->getByKey(bbName.getRawBuffer());
    else
        entityDecl = fDTDGrammar->getEntityDecl(bbName.getRawBuffer());

    if (entityDecl)
    {
        if (!fDumEntityDecl)
            fDumEntityDecl = new (fMemoryManager) DTDEntityDecl(fMemoryManager);
        fDumEntityDecl->setName(bbName.getRawBuffer());
        entityDecl = fDumEntityDecl;
    }
     else
    {
        // Its not in existence already, then create an entity decl for it
        entityDecl = new (fGrammarPoolMemoryManager) DTDEntityDecl(bbName.getRawBuffer(), false, fGrammarPoolMemoryManager);

        //
        //  Set the declaration location. The parameter indicates whether its
        //  declared in the content/internal subset, so we know whether or not
        //  its in the external subset.
        //
        entityDecl->setDeclaredInIntSubset(fInternalSubset);

        // Add it to the appropriate entity decl pool
        if (isPEDecl)
            fPEntityDeclPool->put(entityDecl);
         else
            fDTDGrammar->putEntityDecl(entityDecl);
    }

    // Set a flag that indicates whether we are ignoring this one
    const bool isIgnored = (entityDecl == fDumEntityDecl);

    // Set the PE flag on it
    entityDecl->setIsParameter(isPEDecl);

    //
    //  Space is legal (required actually) here so check for a PE ref. If
    //  we don't get our whitespace, then issue an error, but try to keep
    //  going.
    //
    if (!checkForPERef(false, true))
        fScanner->emitError(XMLErrs::ExpectedWhitespace);

    // save the hasNoDTD status for Entity Constraint Checking
    bool hasNoDTD = fScanner->getHasNoDTD();
    if (hasNoDTD && isPEDecl)
        fScanner->setHasNoDTD(false);

    // According to the type call the value scanning method
    if (!scanEntityDef(*entityDecl, isPEDecl))
    {
        fReaderMgr->skipPastChar(chCloseAngle);
        fScanner->setHasNoDTD(true);
        fScanner->emitError(XMLErrs::ExpectedEntityValue);
        return;
    }
    if (hasNoDTD)
        fScanner->setHasNoDTD(true);

    // Space is legal (but not required) here so check for a PE ref
    checkForPERef(false, true);

    // And then we have to have the closing angle bracket
    if (!fReaderMgr->skippedChar(chCloseAngle))
    {
        fScanner->emitError(XMLErrs::UnterminatedEntityDecl, entityDecl->getName());
        fReaderMgr->skipPastChar(chCloseAngle);
    }

    //
    //  If we have a doc type handler, then call it. But only call it for
    //  ignored elements if advanced callbacks are enabled.
    //
    if (fDocTypeHandler)
        fDocTypeHandler->entityDecl(*entityDecl, isPEDecl, isIgnored);
}